

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

int Str_ObjCreate(Str_Ntk_t *p,int Type,int nFanins,int *pFanins)

{
  int *piVar1;
  Str_Obj_t *pSVar2;
  uint __line;
  int iVar3;
  char *__assertion;
  ulong uVar4;
  ulong uVar5;
  
  iVar3 = p->nObjs;
  if (iVar3 < p->nObjsAlloc) {
    pSVar2 = p->pObjs;
    *(uint *)(pSVar2 + iVar3) = nFanins << 4 | Type & 0xfU;
    pSVar2[iVar3].iOffset = (p->vFanins).nSize;
    pSVar2[iVar3].iTop = -1;
    pSVar2[iVar3].iCopy = -1;
    uVar4 = 0;
    uVar5 = (ulong)(uint)nFanins;
    if (nFanins < 1) {
      uVar5 = uVar4;
    }
    do {
      if (uVar5 == uVar4) {
        p->nObjCount[(uint)Type] = p->nObjCount[(uint)Type] + 1;
        iVar3 = p->nObjs;
        p->nObjs = iVar3 + 1;
        iVar3 = Abc_Var2Lit(iVar3,0);
        return iVar3;
      }
      Vec_IntPush(&p->vFanins,pFanins[uVar4]);
      piVar1 = pFanins + uVar4;
      uVar4 = uVar4 + 1;
    } while (-1 < *piVar1);
    __assertion = "pFanins[i] >= 0";
    __line = 0x78;
  }
  else {
    __assertion = "p->nObjs < p->nObjsAlloc";
    __line = 0x70;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                ,__line,"int Str_ObjCreate(Str_Ntk_t *, int, int, int *)");
}

Assistant:

static inline int Str_ObjCreate( Str_Ntk_t * p, int Type, int nFanins, int * pFanins )
{
    Str_Obj_t * pObj = p->pObjs + p->nObjs; int i;
    assert( p->nObjs < p->nObjsAlloc );
    pObj->Type    = Type;
    pObj->nFanins = nFanins;
    pObj->iOffset = Vec_IntSize(&p->vFanins);
    pObj->iTop    = pObj->iCopy = -1;
    for ( i = 0; i < nFanins; i++ )
    {
        Vec_IntPush( &p->vFanins, pFanins[i] );
        assert( pFanins[i] >= 0 );
    }
    p->nObjCount[Type]++;
    return Abc_Var2Lit( p->nObjs++, 0 );
}